

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

DecodeRawTransactionTxOutStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionTxOut::ConvertToStruct
          (DecodeRawTransactionTxOutStruct *__return_storage_ptr__,DecodeRawTransactionTxOut *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  char local_c8 [16];
  int local_b8;
  _Alloc_hider local_b0;
  char local_a0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __return_storage_ptr__->value = 0;
  __return_storage_ptr__->n = 0;
  (__return_storage_ptr__->script_pub_key).asm_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->script_pub_key).asm_.field_2;
  (__return_storage_ptr__->script_pub_key).asm_._M_string_length = 0;
  (__return_storage_ptr__->script_pub_key).asm_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->script_pub_key).hex._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->script_pub_key).hex.field_2;
  (__return_storage_ptr__->script_pub_key).hex._M_string_length = 0;
  (__return_storage_ptr__->script_pub_key).hex.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->script_pub_key).req_sigs = 0;
  (__return_storage_ptr__->script_pub_key).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->script_pub_key).type.field_2;
  (__return_storage_ptr__->script_pub_key).type._M_string_length = 0;
  (__return_storage_ptr__->script_pub_key).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header
  ;
  (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_color = _S_red;
  (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->value = this->value_;
  __return_storage_ptr__->n = this->n_;
  DecodeLockingScript::ConvertToStruct((DecodeLockingScriptStruct *)local_f8,&this->script_pub_key_)
  ;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->script_pub_key,(string *)local_f8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).hex,(string *)&local_d8);
  (__return_storage_ptr__->script_pub_key).req_sigs = local_b8;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_pub_key).type,(string *)&local_b0);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->script_pub_key).addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->script_pub_key).addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->script_pub_key).addresses.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_90.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_90.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->script_pub_key).addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_90.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->script_pub_key).ignore_items._M_t);
  if (local_78._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_78._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_78._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = local_78._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_78._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->script_pub_key).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_78._M_impl.super__Rb_tree_header._M_node_count;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (local_d8._M_p != local_c8) {
    operator_delete(local_d8._M_p);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionTxOutStruct DecodeRawTransactionTxOut::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionTxOutStruct result;
  result.value = value_;
  result.n = n_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}